

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmUtility.cpp
# Opt level: O0

uint8_t GmmIsUVPacked(GMM_RESOURCE_FORMAT Format)

{
  uint8_t local_d;
  uint8_t Status;
  GMM_RESOURCE_FORMAT Format_local;
  
  if (((Format - GMM_FORMAT_NV11 < 3) || (Format - GMM_FORMAT_P010 < 4)) ||
     (Format == GMM_FORMAT_P216)) {
    local_d = '\x01';
  }
  else {
    local_d = '\0';
  }
  return local_d;
}

Assistant:

uint8_t GMM_STDCALL GmmIsUVPacked(GMM_RESOURCE_FORMAT Format)
{
    uint8_t Status = 0;

    switch(Format)
    {
        case GMM_FORMAT_NV11:
        case GMM_FORMAT_NV12:
        case GMM_FORMAT_NV21:
        case GMM_FORMAT_P010:
        case GMM_FORMAT_P012:
        case GMM_FORMAT_P016:
        case GMM_FORMAT_P208:
        case GMM_FORMAT_P216:
            Status = 1;
            break;
        default:
            Status = 0;
            break;
    }
    return Status;
}